

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void fft_execute(fft_plan p)

{
  double dVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint in_stack_00000008;
  int in_stack_0000000c;
  undefined8 *in_stack_00000018;
  long in_stack_00000020;
  undefined8 *in_stack_00000028;
  
  uVar3 = (ulong)in_stack_00000008;
  if (in_stack_0000000c == 1) {
    if (in_stack_00000018 == (undefined8 *)0x0) {
      if (0 < (int)in_stack_00000008) {
        uVar5 = 0;
        do {
          *(undefined8 *)(p._8_8_ + uVar5 * 8) = *(undefined8 *)(in_stack_00000020 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
      }
      rdft(in_stack_00000008,1,(double *)p._8_8_,(int *)p.c_in,p.in);
      *in_stack_00000028 = *(undefined8 *)p._8_8_;
      in_stack_00000028[1] = 0;
      uVar2 = (int)in_stack_00000008 / 2;
      if (3 < (int)in_stack_00000008) {
        uVar3 = 2;
        if (2 < (int)uVar2) {
          uVar3 = (ulong)uVar2;
        }
        lVar4 = 0;
        do {
          *(undefined8 *)((long)in_stack_00000028 + lVar4 + 0x10) =
               *(undefined8 *)(p._8_8_ + 0x10 + lVar4);
          *(ulong *)((long)in_stack_00000028 + lVar4 + 0x18) =
               *(ulong *)(p._8_8_ + 0x18 + lVar4) ^ 0x8000000000000000;
          lVar4 = lVar4 + 0x10;
        } while (uVar3 * 0x10 + -0x10 != lVar4);
      }
      in_stack_00000028[(long)(int)uVar2 * 2] = *(undefined8 *)(p._8_8_ + 8);
      in_stack_00000028[(long)(int)uVar2 * 2 + 1] = 0;
    }
    else {
      if ((int)in_stack_00000008 < 1) {
        cftfsub(in_stack_00000008 * 2,(double *)p._8_8_,(int *)p.c_in,*(int *)*p.c_in,p.in);
        return;
      }
      lVar4 = 0;
      do {
        *(undefined8 *)(p._8_8_ + lVar4) = *(undefined8 *)((long)in_stack_00000018 + lVar4);
        *(undefined8 *)(p._8_8_ + 8 + lVar4) = *(undefined8 *)((long)in_stack_00000018 + lVar4 + 8);
        lVar4 = lVar4 + 0x10;
      } while (uVar3 << 4 != lVar4);
      cftfsub(in_stack_00000008 * 2,(double *)p._8_8_,(int *)p.c_in,*(int *)*p.c_in,p.in);
      if (0 < (int)in_stack_00000008) {
        lVar4 = 0;
        do {
          *(undefined8 *)((long)in_stack_00000028 + lVar4) = *(undefined8 *)(p._8_8_ + lVar4);
          *(ulong *)((long)in_stack_00000028 + lVar4 + 8) =
               *(ulong *)(p._8_8_ + 8 + lVar4) ^ 0x8000000000000000;
          lVar4 = lVar4 + 0x10;
        } while (uVar3 << 4 != lVar4);
      }
    }
  }
  else if (in_stack_00000028 == (undefined8 *)0x0) {
    *(undefined8 *)p._8_8_ = *in_stack_00000018;
    uVar2 = (int)in_stack_00000008 / 2;
    *(undefined8 *)(p._8_8_ + 8) = in_stack_00000018[(long)(int)uVar2 * 2];
    if (3 < (int)in_stack_00000008) {
      uVar5 = 2;
      if (2 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      lVar4 = 0;
      do {
        *(undefined8 *)(p._8_8_ + 0x10 + lVar4) =
             *(undefined8 *)((long)in_stack_00000018 + lVar4 + 0x10);
        *(ulong *)(p._8_8_ + 0x18 + lVar4) =
             *(ulong *)((long)in_stack_00000018 + lVar4 + 0x18) ^ 0x8000000000000000;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 * 0x10 + -0x10 != lVar4);
    }
    rdft(in_stack_00000008,-1,(double *)p._8_8_,(int *)p.c_in,p.in);
    if (0 < (int)in_stack_00000008) {
      uVar5 = 0;
      do {
        dVar1 = *(double *)(p._8_8_ + uVar5 * 8);
        *(double *)(p._0_8_ + uVar5 * 8) = dVar1 + dVar1;
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else {
    if ((int)in_stack_00000008 < 1) {
      cftbsub(in_stack_00000008 * 2,(double *)p._8_8_,(int *)p.c_in,*(int *)*p.c_in,p.in);
      return;
    }
    lVar4 = 0;
    do {
      *(undefined8 *)(p._8_8_ + lVar4) = *(undefined8 *)((long)in_stack_00000018 + lVar4);
      *(undefined8 *)(p._8_8_ + 8 + lVar4) = *(undefined8 *)((long)in_stack_00000018 + lVar4 + 8);
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
    cftbsub(in_stack_00000008 * 2,(double *)p._8_8_,(int *)p.c_in,*(int *)*p.c_in,p.in);
    if (0 < (int)in_stack_00000008) {
      lVar4 = 0;
      do {
        *(undefined8 *)((long)in_stack_00000028 + lVar4) = *(undefined8 *)(p._8_8_ + lVar4);
        *(ulong *)((long)in_stack_00000028 + lVar4 + 8) =
             *(ulong *)(p._8_8_ + 8 + lVar4) ^ 0x8000000000000000;
        lVar4 = lVar4 + 0x10;
      } while (uVar3 << 4 != lVar4);
    }
  }
  return;
}

Assistant:

void fft_execute(fft_plan p) {
  if (p.sign == FFT_FORWARD) {
    ForwardFFT(p);
  } else {  // ifft
    BackwardFFT(p);
  }
}